

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void save_deblock_boundary_lines
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int plane,int row,int stripe,int use_highbd
               ,int is_above,RestorationStripeBoundaries *boundaries)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  void *__src;
  byte bVar7;
  int in_ECX;
  int in_EDX;
  AV1_COMMON *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  uint8_t *in_stack_00000018;
  int i;
  int ss_x;
  int line_bytes;
  int upscaled_width;
  int lines_to_save;
  uint8_t *bdry_rows;
  int bdry_stride;
  uint8_t *bdry_start;
  uint8_t *bdry_buf;
  uint8_t *src_rows;
  int in_stack_00000060;
  int src_stride;
  uint8_t *src_buf;
  int is_uv;
  int in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff70;
  byte bVar8;
  int iVar9;
  int stride;
  long lVar10;
  uint8_t *buf;
  int local_74;
  int local_6c;
  
  uVar2 = (uint)(0 < in_EDX);
  if (in_R9D == 0) {
    puVar6 = *(uint8_t **)(in_RDI + 0x28 + (long)in_EDX * 8);
  }
  else {
    puVar6 = (uint8_t *)(*(long *)(in_RDI + 0x28 + (long)in_EDX * 8) << 1);
  }
  bVar7 = (byte)in_R9D;
  iVar3 = *(int *)(in_RDI + 0x20 + (long)(int)uVar2 * 4) << (bVar7 & 0x1f);
  if (in_stack_00000008 == 0) {
    lVar10 = *(long *)(CONCAT44(in_stack_00000014,in_stack_00000010) + 8);
  }
  else {
    lVar10 = *(long *)CONCAT44(in_stack_00000014,in_stack_00000010);
  }
  iVar4 = *(int *)(CONCAT44(in_stack_00000014,in_stack_00000010) + 0x10) << (bVar7 & 0x1f);
  __src = (void *)(lVar10 + (4 << (bVar7 & 0x1f)) + (long)(in_R8D * 2 * iVar4));
  if (*(int *)(in_RDI + 0x18 + (long)(int)uVar2 * 4) - in_ECX < 3) {
    iVar9 = *(int *)(in_RDI + 0x18 + (long)(int)uVar2 * 4) - in_ECX;
  }
  else {
    iVar9 = 2;
  }
  stride = iVar9;
  buf = puVar6;
  iVar5 = av1_superres_scaled(in_RSI);
  if (iVar5 == 0) {
    local_6c = *(int *)(in_RDI + 0x10 + (long)(int)uVar2 * 4) << (bVar7 & 0x1f);
    for (local_74 = 0; local_74 < iVar9; local_74 = local_74 + 1) {
      memcpy((void *)((long)__src + (long)(local_74 * iVar4)),
             puVar6 + (long)(local_74 * iVar3) + (long)in_ECX * (long)iVar3,(long)local_6c);
    }
  }
  else {
    uVar1 = in_stack_ffffffffffffff70 & 0xffffff;
    if (uVar2 != 0) {
      uVar1 = CONCAT13(in_RSI->seq_params->subsampling_x != 0,(int3)in_stack_ffffffffffffff70);
    }
    in_stack_ffffffffffffff70 = uVar1;
    bVar8 = (byte)(in_stack_ffffffffffffff70 >> 0x18);
    local_6c = ((int)(in_RSI->superres_upscaled_width + (uint)bVar8) >> bVar8) << (bVar7 & 0x1f);
    if (in_R9D == 0) {
      av1_upscale_normative_rows
                (_upscaled_width,_ss_x,i,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                 in_stack_00000060);
    }
    else {
      av1_upscale_normative_rows
                (_upscaled_width,_ss_x,i,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                 in_stack_00000060);
    }
  }
  if (iVar9 == 1) {
    memcpy((void *)((long)__src + (long)iVar4),__src,(long)local_6c);
  }
  extend_lines(buf,(int)((ulong)lVar10 >> 0x20),(int)lVar10,stride,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c);
  return;
}

Assistant:

static void save_deblock_boundary_lines(
    const YV12_BUFFER_CONFIG *frame, const AV1_COMMON *cm, int plane, int row,
    int stripe, int use_highbd, int is_above,
    RestorationStripeBoundaries *boundaries) {
  const int is_uv = plane > 0;
  const uint8_t *src_buf = REAL_PTR(use_highbd, frame->buffers[plane]);
  const int src_stride = frame->strides[is_uv] << use_highbd;
  const uint8_t *src_rows = src_buf + row * (ptrdiff_t)src_stride;

  uint8_t *bdry_buf = is_above ? boundaries->stripe_boundary_above
                               : boundaries->stripe_boundary_below;
  uint8_t *bdry_start = bdry_buf + (RESTORATION_EXTRA_HORZ << use_highbd);
  const int bdry_stride = boundaries->stripe_boundary_stride << use_highbd;
  uint8_t *bdry_rows = bdry_start + RESTORATION_CTX_VERT * stripe * bdry_stride;

  // There is a rare case in which a processing stripe can end 1px above the
  // crop border. In this case, we do want to use deblocked pixels from below
  // the stripe (hence why we ended up in this function), but instead of
  // fetching 2 "below" rows we need to fetch one and duplicate it.
  // This is equivalent to clamping the sample locations against the crop border
  const int lines_to_save =
      AOMMIN(RESTORATION_CTX_VERT, frame->crop_heights[is_uv] - row);
  assert(lines_to_save == 1 || lines_to_save == 2);

  int upscaled_width;
  int line_bytes;
  if (av1_superres_scaled(cm)) {
    const int ss_x = is_uv && cm->seq_params->subsampling_x;
    upscaled_width = (cm->superres_upscaled_width + ss_x) >> ss_x;
    line_bytes = upscaled_width << use_highbd;
    if (use_highbd)
      av1_upscale_normative_rows(
          cm, CONVERT_TO_BYTEPTR(src_rows), frame->strides[is_uv],
          CONVERT_TO_BYTEPTR(bdry_rows), boundaries->stripe_boundary_stride,
          plane, lines_to_save);
    else
      av1_upscale_normative_rows(cm, src_rows, frame->strides[is_uv], bdry_rows,
                                 boundaries->stripe_boundary_stride, plane,
                                 lines_to_save);
  } else {
    upscaled_width = frame->crop_widths[is_uv];
    line_bytes = upscaled_width << use_highbd;
    for (int i = 0; i < lines_to_save; i++) {
      memcpy(bdry_rows + i * bdry_stride, src_rows + i * src_stride,
             line_bytes);
    }
  }
  // If we only saved one line, then copy it into the second line buffer
  if (lines_to_save == 1)
    memcpy(bdry_rows + bdry_stride, bdry_rows, line_bytes);

  extend_lines(bdry_rows, upscaled_width, RESTORATION_CTX_VERT, bdry_stride,
               RESTORATION_EXTRA_HORZ, use_highbd);
}